

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O0

void __thiscall wasm::LocalGetCounter::analyze(LocalGetCounter *this,Function *func,Expression *ast)

{
  size_t __new_size;
  Expression *local_20;
  Expression *ast_local;
  Function *func_local;
  LocalGetCounter *this_local;
  
  local_20 = ast;
  ast_local = (Expression *)func;
  func_local = (Function *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->num);
  __new_size = Function::getNumLocals((Function *)ast_local);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->num,__new_size);
  Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::walk
            ((Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_> *)this,
             &local_20);
  return;
}

Assistant:

void analyze(Function* func, Expression* ast) {
    num.clear();
    num.resize(func->getNumLocals());
    walk(ast);
  }